

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

cupdlp_bool PDHG_Check_Termination(CUPDLPwork *pdhg,int bool_print)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int in_ESI;
  long in_RDI;
  int bool_pass;
  CUPDLPscaling *scaling;
  CUPDLPresobj *resobj;
  CUPDLPsettings *settings;
  CUPDLPproblem *problem;
  
  lVar1 = *(long *)(in_RDI + 8);
  lVar2 = *(long *)(in_RDI + 0x10);
  lVar3 = *(long *)(in_RDI + 0x28);
  if (in_ESI != 0) {
    printf("Termination check: %e|%e  %e|%e  %e|%e\n",*(undefined8 *)(lVar2 + 0x28),
           *(double *)(lVar1 + 0x10) * (*(double *)(lVar3 + 0x40) + 1.0),
           *(undefined8 *)(lVar2 + 0x30),
           *(double *)(lVar1 + 0x18) * (*(double *)(lVar3 + 0x38) + 1.0),
           *(undefined8 *)(lVar2 + 0x38),*(undefined8 *)(lVar1 + 0x20));
  }
  if (*(int *)(*(long *)(in_RDI + 8) + 0x28) == 0) {
    bVar4 = false;
    if (*(double *)(lVar2 + 0x28) < *(double *)(lVar1 + 0x10) * (*(double *)(lVar3 + 0x40) + 1.0)) {
      bVar4 = *(double *)(lVar2 + 0x30) <
              *(double *)(lVar1 + 0x18) * (*(double *)(lVar3 + 0x38) + 1.0);
    }
  }
  else {
    bVar4 = false;
    if (*(double *)(lVar2 + 0x28) < *(double *)(lVar1 + 0x10)) {
      bVar4 = *(double *)(lVar2 + 0x30) < *(double *)(lVar1 + 0x18);
    }
  }
  bVar5 = false;
  if (bVar4) {
    bVar5 = *(double *)(lVar2 + 0x38) < *(double *)(lVar1 + 0x20);
  }
  return bVar5;
}

Assistant:

cupdlp_bool PDHG_Check_Termination(CUPDLPwork *pdhg, int bool_print) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPscaling *scaling = pdhg->scaling;
#if PDHG_DISPLAY_TERMINATION_CHECK
  // todo, check, is it correct
  if (bool_print) {
    cupdlp_printf(
        "Termination check: %e|%e  %e|%e  %e|%e\n", resobj->dPrimalFeas,
        settings->dPrimalTol * (1.0 + scaling->dNormRhs), resobj->dDualFeas,
        settings->dDualTol * (1.0 + scaling->dNormCost), resobj->dRelObjGap,
        settings->dGapTol);
  }

#endif
  int bool_pass = 0;
  if (pdhg->settings->iInfNormAbsLocalTermination) {
    bool_pass =
      (resobj->dPrimalFeas < settings->dPrimalTol) &&
      (resobj->dDualFeas < settings->dDualTol);
  } else {
    bool_pass =
      (resobj->dPrimalFeas < settings->dPrimalTol * (1.0 + scaling->dNormRhs)) &&
      (resobj->dDualFeas < settings->dDualTol * (1.0 + scaling->dNormCost));
  }
  bool_pass = bool_pass && (resobj->dRelObjGap < settings->dGapTol);
  return bool_pass;
}